

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void glist_text(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  _symbol *p_Var1;
  _glist *p_Var2;
  t_symbol *sel;
  _undo *p_Var3;
  _glist *x_00;
  void *data;
  t_float tVar4;
  int local_48;
  int local_44;
  int ypix;
  int xpix;
  t_atom at;
  t_text *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *gl_local;
  
  at.a_w.w_symbol = (t_symbol *)pd_new(text_class);
  *(undefined2 *)&((at.a_w.w_array)->a_gp).field_0xc = 0;
  ((at.a_w.w_array)->a_gp).field_0xe = ((at.a_w.w_array)->a_gp).field_0xe & 0xfc;
  p_Var1 = (_symbol *)binbuf_new();
  (at.a_w.w_symbol)->s_next = p_Var1;
  if (argc < 2) {
    p_Var2 = glist_getcanvas(gl);
    sel = gensym("editmode");
    pd_vmess((t_pd *)p_Var2,sel,"i",1);
    ypix = 2;
    at._0_8_ = gensym("comment");
    glist_noselect(gl);
    glist_nograb(gl);
    glist_getnextxy(gl,&local_44,&local_48);
    *(short *)&((at.a_w.w_array)->a_gp).gp_valid = (short)(local_44 / gl->gl_zoom) + -1;
    *(short *)((long)&((at.a_w.w_array)->a_gp).gp_valid + 2) = (short)(local_48 / gl->gl_zoom) + -1;
    binbuf_restore((_binbuf *)(at.a_w.w_symbol)->s_next,1,(t_atom *)&ypix);
    glist_add(gl,(t_gobj *)at.a_w.w_symbol);
    glist_noselect(gl);
    glist_select(gl,(t_gobj *)at.a_w.w_symbol);
    p_Var2 = glist_getcanvas(gl);
    p_Var3 = canvas_undo_get(p_Var2);
    if (p_Var3->u_doing == 0) {
      p_Var2 = glist_getcanvas(gl);
      x_00 = glist_getcanvas(gl);
      data = canvas_undo_set_create(x_00);
      canvas_undo_add(p_Var2,UNDO_CREATE,"create",data);
    }
    p_Var2 = glist_getcanvas(gl);
    canvas_startmotion(p_Var2);
  }
  else {
    tVar4 = atom_getfloatarg(0,argc,argv);
    *(short *)&((at.a_w.w_array)->a_gp).gp_valid = (short)(int)tVar4;
    tVar4 = atom_getfloatarg(1,argc,argv);
    *(short *)((long)&((at.a_w.w_array)->a_gp).gp_valid + 2) = (short)(int)tVar4;
    if (argc < 3) {
      ypix = 2;
      at._0_8_ = gensym("comment");
      binbuf_restore((_binbuf *)(at.a_w.w_symbol)->s_next,1,(t_atom *)&ypix);
    }
    else {
      binbuf_restore((_binbuf *)(at.a_w.w_symbol)->s_next,argc + -2,argv + 2);
    }
    glist_add(gl,(t_gobj *)at.a_w.w_symbol);
  }
  return;
}

Assistant:

void glist_text(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_text *x = (t_text *)pd_new(text_class);
    t_atom at;
    x->te_width = 0;                            /* don't know it yet. */
    x->te_type = T_TEXT;
    x->te_binbuf = binbuf_new();
    if (argc > 1)
    {
        x->te_xpix = atom_getfloatarg(0, argc, argv);
        x->te_ypix = atom_getfloatarg(1, argc, argv);
        if (argc > 2) binbuf_restore(x->te_binbuf, argc-2, argv+2);
        else
        {
            SETSYMBOL(&at, gensym("comment"));
            binbuf_restore(x->te_binbuf, 1, &at);
        }
        glist_add(gl, &x->te_g);
    }
    else
    {
        int xpix, ypix;
        pd_vmess((t_pd *)glist_getcanvas(gl), gensym("editmode"), "i", 1);
        SETSYMBOL(&at, gensym("comment"));
        glist_noselect(gl);
        glist_nograb(gl);
        glist_getnextxy(gl, &xpix, &ypix);
        x->te_xpix = xpix/gl->gl_zoom - 1;
        x->te_ypix = ypix/gl->gl_zoom - 1;
        binbuf_restore(x->te_binbuf, 1, &at);
        glist_add(gl, &x->te_g);
        glist_noselect(gl);
        glist_select(gl, &x->te_g);
            /* it would be nice to "activate" here, but then the second,
            "put-me-down" click changes the text selection, which is quite
            irritating, so I took this back out.  It's OK in messages
            and objects though since there's no text in them at menu
            creation. */
            /* gobj_activate(&x->te_g, gl, 1); */
        if (!canvas_undo_get(glist_getcanvas(gl))->u_doing)
            canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(glist_getcanvas(gl)));
        canvas_startmotion(glist_getcanvas(gl));
    }
}